

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

pair<int,_int> anon_unknown.dwarf_ff589::upload_image(GLenum target,string *path,bool flip)

{
  char *filename;
  stbi_uc *retval_from_stbi_load;
  ostream *poVar1;
  pair<int,_int> pVar2;
  uchar *data;
  int num_channels;
  int height;
  int width;
  bool flip_local;
  string *path_local;
  GLenum target_local;
  
  num_channels = -1;
  data._4_4_ = 0xffffffff;
  data._0_4_ = 0xffffffff;
  height._3_1_ = flip;
  _width = path;
  path_local._4_4_ = target;
  stbi_set_flip_vertically_on_load((uint)flip);
  filename = (char *)std::__cxx11::string::c_str();
  retval_from_stbi_load = stbi_load(filename,&num_channels,(int *)((long)&data + 4),(int *)&data,4);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: Could not load texture: ");
    poVar1 = std::operator<<(poVar1,(string *)_width);
    std::operator<<(poVar1,'\n');
    data._4_4_ = 0xffffffff;
    num_channels = -1;
  }
  else {
    (*gl3wProcs.ptr[0x1d2])
              ((ulong)path_local._4_4_,0,0x8058,(ulong)(uint)num_channels,(ulong)data._4_4_,0,0x1908
               ,0x1401,retval_from_stbi_load);
  }
  stbi_image_free(retval_from_stbi_load);
  pVar2 = std::make_pair<int&,int&>(&num_channels,(int *)((long)&data + 4));
  return pVar2;
}

Assistant:

std::pair< int, int > upload_image( GLenum target, const std::string& path, bool flip = false ) {
    int width(-1), height(-1), num_channels(-1);
    stbi_set_flip_vertically_on_load( flip );
    unsigned char* data = stbi_load( path.c_str(), &width, &height, &num_channels, 4 );
    if( !data ) {
        cerr << "ERROR: Could not load texture: " << path << '\n';
        width = height = -1;
    } else {
        glTexImage2D( target, 0, GL_RGBA8, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data );
    }
    stbi_image_free( data );
    
    return std::make_pair( width, height );
}